

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cc
# Opt level: O1

string * avro::toString_abi_cxx11_(Type type)

{
  int iVar1;
  string *psVar2;
  
  if (toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_);
    if (iVar1 != 0) {
      toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_._M_dataplus._M_p =
           (pointer)&toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_,
                 "Undefined type","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_);
    }
  }
  psVar2 = &toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_;
  if ((uint)type < 0xf) {
    psVar2 = (string *)(strings::typeToString_abi_cxx11_ + (long)type * 0x20);
  }
  return psVar2;
}

Assistant:

const std::string& toString(Type type)
{
    static std::string undefinedType = "Undefined type";
    if (isAvroTypeOrPseudoType(type)) {
        return strings::typeToString[type];
    } else {
        return undefinedType;
    }
}